

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void nlohmann::json_abi_v3_11_3::detail::int_to_string<std::__cxx11::string>
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target,
               size_t value)

{
  string *in_RDI;
  unsigned_long in_stack_00000008;
  string local_30 [40];
  string *local_8;
  
  local_8 = in_RDI;
  std::__cxx11::to_string(in_stack_00000008);
  std::__cxx11::string::operator=(local_8,local_30);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void int_to_string( string_type& target, std::size_t value )
{
    // For ADL
    using std::to_string;
    target = to_string(value);
}